

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

bool __thiscall QMenu::isEmpty(QMenu *this)

{
  qsizetype qVar1;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QList<QAction_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  while( true ) {
    QWidget::actions(&local_48,&this->super_QWidget);
    qVar1 = local_48.d.size;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
      }
    }
    if ((ulong)qVar1 <= uVar3) break;
    QWidget::actions(&local_48,&this->super_QWidget);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
      }
    }
    cVar2 = QAction::isSeparator();
    if (cVar2 == '\0') {
      cVar2 = QAction::isVisible();
      if (cVar2 != '\0') break;
    }
    uVar3 = uVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (ulong)qVar1 <= uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMenu::isEmpty() const
{
    bool ret = true;
    for(int i = 0; ret && i < actions().size(); ++i) {
        const QAction *action = actions().at(i);
        if (!action->isSeparator() && action->isVisible()) {
            ret = false;
        }
    }
    return ret;
}